

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall
Parameter<std::pair<int,int>>::internalSetData<std::__cxx11::string>
          (Parameter<std::pair<int,_int>_> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  bool bVar1;
  string *in_RSI;
  long in_RDI;
  RepType *in_stack_00000050;
  string *in_stack_00000058;
  bool result;
  pair<int,_int> tmp;
  string local_40 [39];
  byte local_19;
  pair<int,_int> local_18 [3];
  
  std::pair<int,_int>::pair<int,_int,_true>(local_18);
  std::__cxx11::string::string(local_40,in_RSI);
  bVar1 = ParameterTraits<std::pair<int,_int>_>::convert(in_stack_00000058,in_stack_00000050);
  std::__cxx11::string::~string(local_40);
  local_19 = bVar1;
  if (bVar1) {
    *(undefined1 *)(in_RDI + 0x2a) = 0;
    std::pair<int,_int>::operator=((pair<int,_int> *)(in_RDI + 0x2c),local_18);
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }